

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptor::GetLocationPath
          (MethodDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int __c;
  ServiceDescriptor *in_RSI;
  char *__s;
  MethodDescriptor *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  service(in_RDI);
  ServiceDescriptor::GetLocationPath
            (in_RSI,(vector<int,_std::allocator<int>_> *)
                    CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  __s = &stack0xffffffffffffffec;
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffffe0,(value_type_conflict2 *)in_RDI);
  index(in_RDI,__s,__c);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_RSI,(value_type_conflict2 *)in_RDI);
  return;
}

Assistant:

void MethodDescriptor::GetLocationPath(std::vector<int>* output) const {
  service()->GetLocationPath(output);
  output->push_back(ServiceDescriptorProto::kMethodFieldNumber);
  output->push_back(index());
}